

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computePvec(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  undefined8 *puVar1;
  long lVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nStack_a8;
  
  bVar7 = 0;
  uVar5 = (ulong)(uint)(this->thevectors->set).thenum;
  lVar6 = uVar5 * 0x10 + -1;
  while (0 < (int)uVar5) {
    lVar2 = uVar5 - 1;
    uVar5 = uVar5 - 1;
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator*(&nStack_a8,
                (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((this->thevectors->set).theitem + (this->thevectors->set).thekey[lVar2].idx),
                &this->theCoPvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    puVar1 = (undefined8 *)
             ((long)&((this->thePvec->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar6 * 8);
    pnVar3 = &nStack_a8;
    puVar4 = puVar1 + -0xf;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)puVar4 = *(undefined4 *)pnVar3;
      pnVar3 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar3 + ((ulong)bVar7 * -2 + 1) * 4);
      puVar4 = (undefined8 *)((long)puVar4 + (ulong)bVar7 * -8 + 4);
    }
    *(int *)(puVar1 + -1) = nStack_a8.m_backend.exp;
    *(bool *)((long)puVar1 + -4) = nStack_a8.m_backend.neg;
    *puVar1 = nStack_a8.m_backend._120_8_;
    lVar6 = lVar6 + -0x10;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computePvec()
{
   int i;

   for(i = coDim() - 1; i >= 0; --i)
      (*thePvec)[i] = vector(i) * (*theCoPvec);
}